

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codeholder.cpp
# Opt level: O1

void __thiscall asmjit::CodeHolder::setLogger(CodeHolder *this,Logger *logger)

{
  CodeEmitter *pCVar1;
  
  this->_logger = logger;
  this->_globalOptions = (this->_globalOptions & 0xfffffffb) + (uint)(logger != (Logger *)0x0) * 4;
  pCVar1 = this->_emitters;
  if (pCVar1 != (CodeEmitter *)0x0) {
    do {
      pCVar1->_globalOptions =
           pCVar1->_globalOptions & 0xfffffffb | (uint)(logger != (Logger *)0x0) << 2;
      pCVar1 = pCVar1->_nextEmitter;
    } while (pCVar1 != (CodeEmitter *)0x0);
  }
  return;
}

Assistant:

void CodeHolder::setLogger(Logger* logger) noexcept {
  uint32_t opt = 0;
  if (logger) opt = CodeEmitter::kOptionLoggingEnabled;

  _logger = logger;
  CodeHolder_setGlobalOption(this, CodeEmitter::kOptionLoggingEnabled, opt);
}